

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalhash.h
# Opt level: O3

void __thiscall
GeneralHash<1,_unsigned_int,_unsigned_char>::update
          (GeneralHash<1,_unsigned_int,_unsigned_char> *this,uchar outchar,uchar inchar)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  
  uVar3 = this->hashvalue * 2;
  this->hashvalue = uVar3;
  if ((this->lastbit & ~uVar3) == 0) {
    uVar3 = uVar3 ^ this->irreduciblepoly;
    this->hashvalue = uVar3;
  }
  uVar1 = (this->hasher).hashvalues[outchar];
  bVar2 = (byte)this->n;
  this->hashvalue =
       this->lastbit - 1 & uVar1 << (bVar2 & 0x1f) ^
       (this->precomputedshift).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_start[uVar1 >> ((char)this->wordsize - bVar2 & 0x1f)] ^
       (this->hasher).hashvalues[inchar] ^ uVar3;
  return;
}

Assistant:

void update(chartype outchar, chartype inchar) {
    hashvalue <<= 1;
    if ((hashvalue & lastbit) == lastbit)
      hashvalue ^= irreduciblepoly;
    //
    hashvaluetype z(hasher.hashvalues[outchar]);
    // the compiler should optimize away the next if/else
    if (precomputationtype == FULLPRECOMP) {
      fastleftshiftn(z);
      hashvalue ^= z ^ hasher.hashvalues[inchar];
    } else {
      fastleftshift(z, n);
      hashvalue ^= z ^ hasher.hashvalues[inchar];
    }
  }